

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.cxx
# Opt level: O3

void __thiscall Time::add(Time *this,Estimator *object)

{
  pointer *pppEVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  iterator __position;
  uint i;
  ulong uVar4;
  Estimator *local_8;
  
  ppEVar3 = (this->timeEstimators).super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->timeEstimators).super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar4 = 0;
  do {
    if ((ulong)((long)__position._M_current - (long)ppEVar3 >> 3) <= uVar4) {
      if (__position._M_current !=
          (this->timeEstimators).super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        *__position._M_current = object;
        pppEVar1 = &(this->timeEstimators).
                    super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppEVar1 = *pppEVar1 + 1;
        return;
      }
      local_8 = object;
      std::vector<Estimator*,std::allocator<Estimator*>>::_M_realloc_insert<Estimator*const&>
                ((vector<Estimator*,std::allocator<Estimator*>> *)&this->timeEstimators,__position,
                 &local_8);
      return;
    }
    ppEVar2 = ppEVar3 + uVar4;
    uVar4 = (ulong)((int)uVar4 + 1);
  } while (*ppEVar2 != object);
  return;
}

Assistant:

void Time::add( class Estimator *object )
{
	// find object in already registered objects
	bool found = false;
	for (uint i=0; !found && i<timeEstimators.size(); ++i)
		if (timeEstimators[i] == object)
			found = true;

	// add if not found
	if (!found)
		timeEstimators.push_back( object );
}